

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenSolver.h
# Opt level: O2

complex<double> Eigen::cdiv<double>(double *xr,double *xi,double *yr,double *yi)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 in_RAX;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  complex<double> cVar10;
  
  dVar8 = *yr;
  dVar7 = *yi;
  dVar1 = *xr;
  dVar2 = *xi;
  if (ABS(dVar8) <= ABS(dVar7)) {
    dVar9 = dVar8 / dVar7;
    dVar7 = dVar8 * dVar9 + dVar7;
    auVar6._0_8_ = dVar2 + dVar1 * dVar9;
    auVar6._8_8_ = -dVar1 + dVar2 * dVar9;
    auVar3._8_8_ = dVar7;
    auVar3._0_8_ = dVar7;
    divpd(auVar6,auVar3);
  }
  else {
    dVar9 = dVar7 / dVar8;
    dVar8 = dVar7 * dVar9 + dVar8;
    auVar5._0_8_ = dVar2 * dVar9 + dVar1;
    auVar5._8_8_ = dVar1 * -dVar9 + dVar2;
    auVar4._8_8_ = dVar8;
    auVar4._0_8_ = dVar8;
    divpd(auVar5,auVar4);
  }
  cVar10._M_value._8_8_ = yr;
  cVar10._M_value._0_8_ = in_RAX;
  return (complex<double>)cVar10._M_value;
}

Assistant:

std::complex<Scalar> cdiv(const Scalar& xr, const Scalar& xi, const Scalar& yr, const Scalar& yi)
{
  using std::abs;
  Scalar r,d;
  if (abs(yr) > abs(yi))
  {
      r = yi/yr;
      d = yr + r*yi;
      return std::complex<Scalar>((xr + r*xi)/d, (xi - r*xr)/d);
  }
  else
  {
      r = yr/yi;
      d = yi + r*yr;
      return std::complex<Scalar>((r*xr + xi)/d, (r*xi - xr)/d);
  }
}